

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O3

uint32_t google::protobuf::internal::GetRecodedTagForFastParsing(FieldDescriptor *field)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  
  iVar1 = field->number_;
  bVar2 = FieldDescriptor::is_packed(field);
  uVar4 = 2;
  if (!bVar2) {
    uVar4 = *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)field->type_ * 4);
  }
  uVar3 = TcParseTableBase::RecodeTagForFastParsing(iVar1 << 3 | uVar4);
  return uVar3;
}

Assistant:

uint32_t GetRecodedTagForFastParsing(const FieldDescriptor* field) {
  return internal::TcParseTableBase::RecodeTagForFastParsing(
      internal::WireFormat::MakeTag(field));
}